

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_map_clear(wally_map *map_in)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  if (map_in != (wally_map *)0x0) {
    uVar1 = map_in->num_items;
    if (uVar1 != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        clear_and_free(*(void **)((long)&map_in->items->key + lVar2),
                       *(size_t *)((long)&map_in->items->key_len + lVar2));
        clear_and_free(*(void **)((long)&map_in->items->value + lVar2),
                       *(size_t *)((long)&map_in->items->value_len + lVar2));
        uVar3 = uVar3 + 1;
        uVar1 = map_in->num_items;
        lVar2 = lVar2 + 0x20;
      } while (uVar3 < uVar1);
    }
    clear_and_free(map_in->items,uVar1 << 5);
    wally_clear(map_in,0x18);
    return 0;
  }
  return -2;
}

Assistant:

int wally_map_clear(struct wally_map *map_in)
{
    size_t i;

    if (!map_in)
        return WALLY_EINVAL;
    for (i = 0; i < map_in->num_items; ++i) {
        clear_and_free(map_in->items[i].key, map_in->items[i].key_len);
        clear_and_free(map_in->items[i].value, map_in->items[i].value_len);
    }
    clear_and_free(map_in->items, map_in->num_items * sizeof(*map_in->items));
    wally_clear(map_in, sizeof(*map_in));
    return WALLY_OK;
}